

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabor.h
# Opt level: O0

void __thiscall gimage::GaborKernel::set(GaborKernel *this,float s,float l,float t,float g,float p)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  long lVar4;
  int __x;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  Image<float,_gimage::PixelTraits<float>_> *pIVar5;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  double dVar6;
  double dVar7;
  double dVar8;
  float in_XMM1_Da;
  uint in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  long i_1;
  long k_1;
  double gs;
  double b;
  double a;
  double ct;
  double st;
  long i;
  long k;
  float *imp;
  float *rep;
  float im_sum;
  float re_sum;
  int h2;
  int w2;
  int kn;
  long local_90;
  long local_88;
  long in_stack_ffffffffffffff88;
  long in_stack_ffffffffffffff90;
  long in_stack_ffffffffffffff98;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_ffffffffffffffa0;
  long local_58;
  long local_50;
  float *local_48;
  float *local_40;
  float local_34;
  float local_30;
  float local_20;
  float local_1c;
  float local_18;
  uint local_14;
  float local_10;
  float local_c [3];
  
  local_20 = 0.5;
  local_1c = in_XMM4_Da;
  local_18 = in_XMM3_Da;
  local_14 = in_XMM2_Da;
  local_10 = in_XMM1_Da;
  pfVar3 = std::max<float>(&local_20,local_c);
  local_c[0] = *pfVar3;
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  lVar4 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RDI);
  iVar1 = (int)(lVar4 >> 1);
  lVar4 = Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RDI);
  iVar2 = (int)(lVar4 >> 1);
  local_30 = 0.0;
  local_34 = 0.0;
  local_40 = Image<float,_gimage::PixelTraits<float>_>::getPtr(in_RDI,0,0,0);
  local_48 = Image<float,_gimage::PixelTraits<float>_>::getPtr(in_RDI + 1,0,0,0);
  for (local_50 = 0; lVar4 = Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RDI),
      local_50 < lVar4; local_50 = local_50 + 1) {
    local_58 = 0;
    while( true ) {
      pIVar5 = in_RDI;
      lVar4 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RDI);
      __x = (int)pIVar5;
      if (lVar4 <= local_58) break;
      dVar6 = std::sin((double)(ulong)local_14);
      dVar6 = (double)SUB84(dVar6,0);
      dVar7 = std::cos((double)(ulong)local_14);
      dVar8 = (double)(local_58 - iVar1) * (double)SUB84(dVar7,0) +
              (double)(local_50 - iVar2) * dVar6;
      dVar6 = (double)-(local_58 - iVar1) * dVar6 +
              (double)(local_50 - iVar2) * (double)SUB84(dVar7,0);
      dVar6 = exp(-(dVar8 * dVar8 + (double)(local_18 * local_18) * dVar6 * dVar6) /
                  (double)(local_c[0] * 2.0 * local_c[0]));
      dVar7 = (dVar8 * 6.283185307179586) / (double)local_10 + (double)local_1c;
      dVar8 = cos(dVar7);
      *local_40 = (float)(dVar6 * dVar8);
      dVar7 = sin(dVar7);
      *local_48 = (float)(dVar6 * dVar7);
      local_40 = local_40 + 1;
      std::abs(__x);
      local_30 = extraout_XMM0_Da + local_30;
      local_48 = local_48 + 1;
      std::abs(__x);
      local_34 = extraout_XMM0_Da_00 + local_34;
      local_58 = local_58 + 1;
    }
  }
  local_40 = Image<float,_gimage::PixelTraits<float>_>::getPtr(in_RDI,0,0,0);
  local_48 = Image<float,_gimage::PixelTraits<float>_>::getPtr(in_RDI + 1,0,0,0);
  for (local_88 = 0; lVar4 = Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RDI),
      local_88 < lVar4; local_88 = local_88 + 1) {
    for (local_90 = 0; lVar4 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RDI),
        local_90 < lVar4; local_90 = local_90 + 1) {
      *local_40 = *local_40 / local_30;
      *local_48 = *local_48 / local_34;
      local_48 = local_48 + 1;
      local_40 = local_40 + 1;
    }
  }
  return;
}

Assistant:

void set(float s, float l, float t, float g=1, float p=0)
    {
      s=std::max(0.5f, s);

      int kn=static_cast<int>(5*s+0.5f);

      if ((kn&1) == 0)
      {
        kn++;
      }

      re.setSize(kn, kn, 1);
      im.setSize(kn, kn, 1);

      int w2=re.getWidth()>>1;
      int h2=re.getHeight()>>1;

      // compute kernels for real and imaginary part

      float re_sum=0;
      float im_sum=0;

      float *rep=re.getPtr(0, 0, 0);
      float *imp=im.getPtr(0, 0, 0);

      for (long k=0; k<re.getHeight(); k++)
      {
        for (long i=0; i<re.getWidth(); i++)
        {
          double st=std::sin(t);
          double ct=std::cos(t);

          double a=(i-w2)*ct+(k-h2)*st;
          double b=-(i-w2)*st+(k-h2)*ct;

          double gs=std::exp(-(a*a+g*g*b*b)/(2*s*s));

          a=2*gmath::pi*a/l+p;

          *rep=static_cast<float>(gs*std::cos(a));
          *imp=static_cast<float>(gs*std::sin(a));

          re_sum+=std::abs(*rep++);
          im_sum+=std::abs(*imp++);
        }
      }

      // normalization of kernal to absolute sum of 1

      rep=re.getPtr(0, 0, 0);
      imp=im.getPtr(0, 0, 0);

      for (long k=0; k<re.getHeight(); k++)
      {
        for (long i=0; i<re.getWidth(); i++)
        {
          *rep++/=re_sum;
          *imp++/=im_sum;
        }
      }
    }